

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall
test::iu_AssertionTest_x_iutest_x_MemCmpNE_Test::Body
          (iu_AssertionTest_x_iutest_x_MemCmpNE_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_220;
  Fixed local_1f0;
  undefined1 local_58 [8];
  AssertionResult iutest_ar;
  TestObjectX y;
  TestObjectX x;
  iu_AssertionTest_x_iutest_x_MemCmpNE_Test *this_local;
  
  stack0xffffffffffffffe0 = 0x100000000;
  iutest_ar.m_result = false;
  iutest_ar._33_7_ = 0x1000000;
  y.a = 3;
  iutest::detail::AlwaysZero();
  iutest::internal::backward::NeHelper<false>::Compare<test::TestObjectX>
            ((AssertionResult *)local_58,"x","y",(TestObjectX *)&y.c,
             (TestObjectX *)&iutest_ar.m_result);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    message = iutest::AssertionResult::message((AssertionResult *)local_58);
    iutest::AssertionHelper::AssertionHelper
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0x7a,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_220,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper(&local_220);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  return;
}

Assistant:

IUTEST(AssertionTest, MemCmpNE)
{
    TestObjectX x={0, 1, 2};
    TestObjectX y={0, 1, 3};
    IUTEST_ASSERT_NE(x, y);
}